

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# next_hit_device.cpp
# Opt level: O0

Vec3ff embree::renderPixelStandard
                 (TutorialData *data,float x,float y,uint width,uint height,ISPCCamera *camera,
                 RayStats *stats,RTCFeatureFlags feature_mask)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  ostream *poVar6;
  void *this;
  int in_EDX;
  long in_RSI;
  float *in_RDI;
  float *in_R8;
  bool bVar7;
  bool bVar8;
  float in_XMM0_Da;
  float fVar9;
  float fVar10;
  undefined1 extraout_var [12];
  undefined1 auVar11 [16];
  float in_XMM1_Da;
  Vec3ff VVar12;
  size_t i_1;
  RandomSampler sampler;
  size_t i;
  RandomSampler verify_sampler;
  HitList verify_hits;
  bool has_error;
  int estimated_num_next_hits;
  int num_prev_hits;
  HitList hits;
  Ray ray;
  RandomSampler mysampler;
  int iy;
  int ix;
  Vec3ff *color;
  uint n_6;
  uint m_6;
  uint r2_6;
  uint r1_6;
  uint c2_6;
  uint c1_6;
  uint n_5;
  uint m_5;
  uint r2_5;
  uint r1_5;
  uint c2_5;
  uint c1_5;
  uint n_4;
  uint m_4;
  uint r2_4;
  uint r1_4;
  uint c2_4;
  uint c1_4;
  uint hash;
  uint n_1;
  uint m_1;
  uint r2_1;
  uint r1_1;
  uint c2_1;
  uint c1_1;
  uint n;
  uint m;
  uint r2;
  uint r1;
  uint c2;
  uint c1;
  uint hash_1;
  uint n_3;
  uint m_3;
  uint r2_3;
  uint r1_3;
  uint c2_3;
  uint c1_3;
  uint n_2;
  uint m_2;
  uint r2_2;
  uint r1_2;
  uint c2_2;
  uint c1_2;
  vint4 mask_1;
  vint4 mask;
  uint n_9;
  uint m_9;
  uint n_8;
  uint m_8;
  uint n_7;
  uint m_7;
  __m128 c;
  __m128 r;
  __m128 a;
  float in_stack_ffffffffffff5488;
  float in_stack_ffffffffffff548c;
  float in_stack_ffffffffffff5490;
  int in_stack_ffffffffffff5494;
  undefined8 local_ab38;
  undefined8 uStack_ab30;
  ulong local_ab28;
  uint local_ab1c;
  ulong local_ab18;
  uint local_ab0c [3];
  uint local_ab00;
  uint local_aafc;
  undefined1 auStack_aaf8 [4];
  float fStack_aaf4;
  uint auStack_aaf0 [8];
  RayStats *in_stack_ffffffffffff5530;
  undefined4 in_stack_ffffffffffff5538;
  RTCFeatureFlags in_stack_ffffffffffff553c;
  undefined4 in_stack_ffffffffffff5540;
  int in_stack_ffffffffffff5544;
  HitList *in_stack_ffffffffffff5548;
  HitList *in_stack_ffffffffffff5550;
  Ray *in_stack_ffffffffffff5558;
  TutorialData *in_stack_ffffffffffff5560;
  RTCFeatureFlags in_stack_ffffffffffff55d0;
  HitList local_5ae8;
  float local_ad4 [3];
  float local_ac8 [3];
  float local_abc [3];
  float local_ab0 [3];
  float local_aa4 [3];
  undefined8 local_a98;
  ulong uStack_a90;
  undefined8 local_a88;
  ulong uStack_a80;
  undefined8 local_a78;
  ulong uStack_a70;
  undefined8 local_a68;
  ulong uStack_a60;
  float local_a58;
  undefined4 local_a54;
  undefined1 auStack_a48 [20];
  undefined4 local_a34;
  undefined4 local_a30;
  undefined4 local_a2c;
  undefined4 local_a28;
  uint local_a14;
  int local_a10;
  uint local_a0c;
  int local_9f4;
  float local_9f0;
  float local_9ec;
  long local_9e8;
  undefined1 *local_9d8;
  undefined4 local_9cc;
  int local_9c8;
  uint local_9c4;
  uint *local_9c0;
  undefined4 local_9b4;
  int local_9b0;
  uint local_9ac;
  uint *local_9a8;
  float *local_9a0;
  undefined8 *local_998;
  float *local_990;
  undefined8 *local_988;
  float local_97c;
  float *local_978;
  float *local_970;
  float local_964;
  float local_960;
  float local_95c;
  float *local_958;
  float *local_950;
  float *local_948;
  float local_93c;
  float local_938;
  float local_934;
  float *local_930;
  float *local_928;
  float *local_920;
  float local_914;
  float local_910;
  float local_90c;
  float *local_908;
  float *local_900;
  float *local_8f8;
  float local_8ec;
  float local_8e8;
  float local_8e4 [3];
  float *local_8d8;
  float *local_8d0;
  undefined4 local_8c8;
  undefined4 local_8c4;
  undefined4 local_8c0;
  undefined4 local_8bc;
  float local_8b8;
  undefined4 local_8b4;
  undefined8 *local_8b0;
  undefined8 *local_8a8;
  undefined8 *local_8a0;
  int local_898;
  undefined4 local_894;
  float local_890;
  float local_88c;
  float local_888;
  undefined4 local_884;
  Hit *local_880;
  undefined1 *local_878;
  Hit *local_870;
  undefined1 *local_868;
  undefined4 local_85c;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  undefined4 local_84c;
  undefined4 local_848;
  uint local_844;
  uint local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  undefined4 local_82c;
  undefined4 local_828;
  uint local_824;
  uint local_820;
  undefined4 local_81c;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  uint local_804;
  uint local_800;
  uint local_7fc;
  uint *local_7f0;
  uint *local_7e8;
  uint *local_7e0;
  undefined4 local_7d4;
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined8 *local_7c8;
  undefined8 *local_7c0;
  uint local_7ac;
  undefined4 local_7a8;
  uint local_7a4;
  uint *local_7a0;
  undefined4 local_798;
  undefined4 local_794;
  undefined4 local_790;
  undefined4 local_78c;
  undefined4 local_788;
  undefined4 local_784;
  undefined4 local_780;
  uint local_77c;
  undefined4 local_778;
  undefined4 local_774;
  undefined4 local_770;
  undefined4 local_76c;
  undefined4 local_768;
  undefined4 local_764;
  uint local_760;
  uint local_75c;
  uint local_758;
  uint local_754;
  undefined4 local_750;
  uint local_74c;
  uint *local_748;
  undefined4 local_73c;
  undefined4 local_738;
  undefined4 local_734;
  undefined4 local_730;
  undefined4 local_72c;
  undefined4 local_728;
  undefined4 local_724;
  uint local_720;
  undefined4 local_71c;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined4 local_70c;
  undefined4 local_708;
  uint local_704;
  uint local_700;
  uint local_6fc;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined4 local_6e8;
  undefined4 local_6e4;
  undefined4 local_6e0;
  undefined4 local_6dc;
  undefined8 local_6d8;
  ulong uStack_6d0;
  float local_6c8;
  undefined4 local_6bc;
  undefined8 local_6b8;
  ulong uStack_6b0;
  float local_6a8;
  float local_6a4;
  float local_6a0;
  undefined4 local_69c;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  ulong uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  ulong uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined4 local_63c;
  undefined8 *local_638;
  undefined8 *local_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  ulong uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  ulong uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined4 local_5d4;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined1 *local_5c0;
  undefined4 local_5b8;
  undefined4 local_5b4;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined8 *local_5a8;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  undefined4 local_594;
  undefined8 *local_590;
  undefined8 *local_588;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined8 *local_570;
  undefined8 *local_568;
  undefined8 *local_560;
  undefined8 *local_558;
  undefined8 *local_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 *local_528;
  undefined8 *local_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 *local_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 *local_4e0;
  undefined8 local_4d8;
  ulong uStack_4d0;
  undefined8 *local_4c0;
  undefined8 local_4b8;
  ulong uStack_4b0;
  undefined8 *local_4a0;
  undefined8 local_498;
  ulong uStack_490;
  undefined8 *local_480;
  undefined8 local_478;
  ulong uStack_470;
  undefined8 *local_460;
  undefined4 local_454;
  undefined8 *local_450;
  undefined4 local_444;
  undefined8 *local_440;
  undefined8 *local_438;
  undefined8 *local_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined4 local_418;
  undefined4 local_414;
  undefined4 local_410;
  undefined4 local_40c;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined4 local_3f8;
  undefined4 local_3f4;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  ulong uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  ulong uStack_3b0;
  undefined8 local_3a8;
  ulong uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  ulong uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 *local_368;
  undefined8 *local_360;
  undefined8 *local_358;
  undefined8 *local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  undefined4 local_2b4;
  uint *local_2b0;
  uint *local_2a8;
  uint *local_2a0;
  undefined4 local_294;
  undefined4 local_290;
  uint local_28c;
  undefined4 local_288;
  undefined4 local_284;
  uint local_280;
  undefined4 local_27c;
  undefined4 local_278;
  uint local_274;
  float *local_270;
  float *local_268;
  float *local_260;
  float *local_258;
  float *local_250;
  float *local_248;
  float *local_240;
  float *local_238;
  float *local_230;
  float *local_228;
  float *local_220;
  float *local_218;
  float *local_210;
  float *local_208;
  float *local_200;
  float *local_1f8;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  float *local_1e0;
  float *local_1d8;
  float *local_1d0;
  float *local_1c8;
  float *local_1c0;
  float *local_1b8;
  float *local_1b0;
  ulong local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_198 [16];
  ulong local_188;
  undefined8 uStack_180;
  float local_174;
  float *local_170;
  undefined1 local_168 [16];
  undefined4 local_14c;
  undefined1 local_148 [16];
  undefined4 local_12c;
  undefined1 local_128 [16];
  float local_10c;
  ulong local_108;
  undefined8 uStack_100;
  ulong local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ulong local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  undefined8 uStack_40;
  ulong local_38;
  undefined8 uStack_30;
  float *local_28;
  float *local_20;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  local_a0c = (uint)in_XMM0_Da;
  local_a10 = (int)in_XMM1_Da;
  local_9a8 = &local_a14;
  local_9b4 = 0;
  local_7a4 = local_a0c | local_a10 << 0x10;
  local_7a8 = 0;
  local_764 = 0xcc9e2d51;
  local_768 = 0x1b873593;
  local_76c = 0xf;
  local_770 = 0xd;
  local_774 = 5;
  local_778 = 0xe6546b64;
  uVar4 = local_7a4 * 0x16a88000 | local_7a4 * -0x3361d2af >> 0x11;
  local_760 = uVar4 * 0x1b873593;
  local_75c = (uVar4 * -0x194da000 | local_760 >> 0x13) * 5 + 0xe6546b64;
  local_784 = 0xcc9e2d51;
  local_788 = 0x1b873593;
  local_78c = 0xf;
  local_790 = 0xd;
  local_794 = 5;
  local_798 = 0xe6546b64;
  local_780 = 0;
  local_77c = (local_75c * 0x2000 | local_75c >> 0x13) * 5 + 0xe6546b64;
  uVar4 = (local_77c ^ local_77c >> 0x10) * -0x7a143595;
  local_7ac = (uVar4 ^ uVar4 >> 0xd) * -0x3d4d51cb;
  local_7ac = local_7ac ^ local_7ac >> 0x10;
  local_9a0 = in_R8 + 9;
  local_6a0 = in_R8[0xb];
  local_6a8 = *local_9a0;
  local_6a4 = in_R8[10];
  local_6b8 = *(undefined8 *)local_9a0;
  local_69c = 0;
  uStack_6b0 = (ulong)(uint)local_6a0;
  local_928 = local_ac8;
  local_8d8 = &local_9ec;
  local_8e4[0] = in_XMM0_Da * *in_R8;
  local_260 = local_8e4;
  local_268 = &local_8e8;
  local_270 = &local_8ec;
  local_908 = in_R8 + 3;
  local_930 = local_ad4;
  local_900 = &local_9f0;
  local_90c = in_XMM1_Da * *local_908;
  local_240 = &local_90c;
  local_248 = &local_910;
  local_250 = &local_914;
  local_950 = local_abc;
  local_934 = local_8e4[0] + local_90c;
  local_220 = &local_934;
  local_228 = &local_938;
  local_230 = &local_93c;
  local_958 = in_R8 + 6;
  local_978 = local_ab0;
  local_95c = local_934 + *local_958;
  local_200 = &local_95c;
  local_208 = &local_960;
  local_210 = &local_964;
  local_990 = local_aa4;
  local_c = local_964 * local_964;
  local_18 = local_960 * local_960 + local_c;
  local_174 = local_95c * local_95c + local_18;
  local_128._4_4_ = 0;
  local_128._0_4_ = local_174;
  local_188 = local_128._0_8_;
  uStack_180 = 0;
  local_108 = local_128._0_8_;
  uStack_100 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_128._0_8_;
  local_198 = rsqrtss(auVar2,auVar2);
  local_12c = 0x3fc00000;
  local_148 = ZEXT416(0x3fc00000);
  local_58 = local_198._0_8_;
  uVar3 = local_58;
  uStack_50 = local_198._8_8_;
  local_58._0_4_ = local_198._0_4_;
  local_48 = (ulong)(uint)((float)local_58 * 1.5);
  uStack_40 = 0;
  local_14c = 0xbf000000;
  local_168 = ZEXT416(0xbf000000);
  local_78 = local_168._0_8_;
  uStack_70 = 0;
  local_68 = (ulong)(uint)(local_174 * -0.5);
  uStack_60 = 0;
  local_98 = local_198._0_8_;
  uStack_90 = local_198._8_8_;
  local_97c = local_174 * -0.5 * (float)local_58;
  local_88 = (ulong)(uint)local_97c;
  uStack_80 = 0;
  local_b8 = local_198._0_8_;
  uStack_b0 = local_198._8_8_;
  local_a8 = CONCAT44(local_198._4_4_,(float)local_58 * (float)local_58);
  uStack_a0 = local_198._8_8_;
  local_d8 = local_a8;
  uStack_d0 = local_198._8_8_;
  local_97c = local_97c * (float)local_58 * (float)local_58;
  local_c8 = (ulong)(uint)local_97c;
  uStack_c0 = 0;
  local_f8 = local_c8;
  uStack_f0 = 0;
  local_97c = (float)local_58 * 1.5 + local_97c;
  local_e8 = (ulong)(uint)local_97c;
  uStack_e0 = 0;
  local_1a8 = local_e8;
  uStack_1a0 = 0;
  local_38 = local_e8;
  uStack_30 = 0;
  local_1e0 = &local_97c;
  local_6c8 = local_95c * local_97c;
  fVar9 = local_960 * local_97c;
  fVar10 = local_964 * local_97c;
  local_1b8 = &local_1e4;
  local_1c0 = &local_1e8;
  local_1c8 = &local_1ec;
  local_6d8 = CONCAT44(local_1e8,local_6c8);
  local_6bc = 0;
  uStack_6d0 = (ulong)(uint)local_1ec;
  local_9d8 = &inf;
  local_9f4 = in_EDX;
  local_9f0 = in_XMM1_Da;
  local_9ec = in_XMM0_Da;
  local_9e8 = in_RSI;
  local_9b0 = local_a10;
  local_9ac = local_a0c;
  local_998 = &local_a88;
  local_988 = &local_a98;
  local_970 = local_990;
  local_964 = local_93c + in_R8[8];
  local_960 = local_938 + in_R8[7];
  local_948 = local_978;
  local_93c = local_8ec + local_914;
  local_938 = local_8e8 + local_910;
  local_920 = local_950;
  local_914 = in_XMM1_Da * in_R8[5];
  local_910 = in_XMM1_Da * in_R8[4];
  local_8f8 = local_930;
  local_8ec = in_XMM0_Da * in_R8[2];
  local_8e8 = in_XMM0_Da * in_R8[1];
  local_8d0 = local_928;
  local_7a0 = local_9a8;
  local_758 = local_7ac;
  local_258 = local_928;
  local_238 = local_930;
  local_218 = local_950;
  local_1f8 = local_978;
  local_1ec = fVar10;
  local_1e8 = fVar9;
  local_1e4 = local_6c8;
  local_1d8 = local_978;
  local_1d0 = local_990;
  local_1b0 = local_990;
  local_170 = local_978;
  local_128 = ZEXT416((uint)local_174);
  local_10c = local_174;
  local_58 = uVar3;
  local_28 = local_978;
  local_20 = local_978;
  local_14 = local_95c;
  local_10 = local_95c;
  local_ad4[0] = local_90c;
  local_ac8[0] = local_8e4[0];
  local_abc[0] = local_934;
  local_ab0[0] = local_95c;
  local_aa4[0] = local_6c8;
  local_a98 = local_6d8;
  uStack_a90 = uStack_6d0;
  local_a88 = local_6b8;
  uStack_a80 = uStack_6b0;
  local_a14 = local_7ac;
  local_8b8 = std::numeric_limits<float>::infinity();
  local_8a0 = &local_a78;
  local_8b4 = 0;
  local_8bc = 0;
  local_8c0 = 0xffffffff;
  local_8c4 = 0xffffffff;
  local_8c8 = 0xffffffff;
  local_5d4 = 0;
  local_5a8 = &local_5e8;
  local_5ac = 0xffffffff;
  local_5b0 = 0xffffffff;
  local_5b4 = 0xffffffff;
  local_5b8 = 0;
  local_3ec = 0;
  local_3f0 = 0xffffffff;
  local_3f4 = 0xffffffff;
  local_3f8 = 0xffffffff;
  local_408 = 0xffffffffffffffff;
  uStack_400 = 0xffffffff;
  local_5e8 = 0xffffffffffffffff;
  uStack_5e0 = 0xffffffff;
  local_548 = 0xffffffffffffffff;
  uStack_540 = 0xffffffff;
  local_578 = &local_608;
  local_608 = 0xffffffffffffffff;
  uStack_600 = 0xffffffff;
  local_4b8 = local_a88;
  uStack_490 = uStack_a80;
  local_580 = &local_618;
  local_588 = &local_628;
  local_454 = 0;
  local_2b4 = 0;
  local_2c8 = 0;
  uStack_2c4 = 0;
  uStack_2c0 = 0;
  uStack_2bc = 0;
  local_308 = 0;
  uStack_300 = 0;
  local_570 = &local_5f8;
  local_378 = 0xffffffffffffffff;
  uStack_370 = 0xffffffff;
  uStack_4b0 = uStack_a80 & 0xffffffff;
  local_2f8 = 0xffffffffffffffff;
  uStack_2f0 = 0xffffffff;
  local_3c8 = 0;
  uStack_3c0 = 0;
  local_630 = &local_a68;
  local_63c = 0;
  local_590 = &local_658;
  local_594 = 0xffffffff;
  local_598 = 0xffffffff;
  local_59c = 0xffffffff;
  local_5a0 = 0;
  local_40c = 0;
  local_410 = 0xffffffff;
  local_414 = 0xffffffff;
  local_418 = 0xffffffff;
  local_428 = 0xffffffffffffffff;
  uStack_420 = 0xffffffff;
  local_658 = 0xffffffffffffffff;
  uStack_650 = 0xffffffff;
  local_538 = 0xffffffffffffffff;
  uStack_530 = 0xffffffff;
  local_558 = &local_678;
  local_678 = 0xffffffffffffffff;
  uStack_670 = 0xffffffff;
  local_4d8 = local_a98;
  uStack_470 = uStack_a90;
  local_560 = &local_688;
  local_568 = &local_698;
  local_444 = 0;
  local_2cc = 0;
  local_2e8 = 0;
  uStack_2e4 = 0;
  uStack_2e0 = 0;
  uStack_2dc = 0;
  local_328 = 0;
  uStack_320 = 0;
  local_550 = &local_668;
  local_398 = 0xffffffffffffffff;
  uStack_390 = 0xffffffff;
  uStack_4d0 = uStack_a90 & 0xffffffff;
  local_318 = 0xffffffffffffffff;
  uStack_310 = 0xffffffff;
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_a54 = 0xffffffff;
  local_5c0 = auStack_a48;
  local_a34 = 0xffffffff;
  local_a30 = 0xffffffff;
  local_a2c = 0xffffffff;
  local_a28 = 0xffffffff;
  local_8b0 = &local_a98;
  local_8a8 = &local_a88;
  local_638 = &local_a98;
  local_5d0 = &local_a88;
  local_5c8 = local_8a0;
  local_528 = local_5a8;
  local_520 = local_590;
  local_518 = local_548;
  uStack_510 = uStack_540;
  local_500 = local_578;
  local_4f8 = local_538;
  uStack_4f0 = uStack_530;
  local_4e0 = local_558;
  local_4c0 = local_550;
  local_4a0 = local_570;
  local_498 = local_4b8;
  local_480 = local_580;
  local_478 = local_4d8;
  local_460 = local_560;
  local_450 = local_588;
  local_440 = local_568;
  local_438 = local_570;
  local_430 = local_550;
  local_3d8 = local_4d8;
  uStack_3d0 = uStack_4d0;
  local_3b8 = local_4b8;
  uStack_3b0 = uStack_4b0;
  local_3a8 = local_4d8;
  uStack_3a0 = uStack_470;
  local_388 = local_4b8;
  uStack_380 = uStack_490;
  local_368 = local_558;
  local_360 = local_558;
  local_358 = local_578;
  local_350 = local_578;
  local_348 = local_568;
  local_340 = local_560;
  local_338 = local_588;
  local_330 = local_580;
  local_a78 = local_4b8;
  uStack_a70 = uStack_4b0;
  local_a68 = local_4d8;
  uStack_a60 = uStack_4d0;
  local_a58 = local_8b8;
  local_698 = local_328;
  uStack_690 = uStack_320;
  local_688 = local_4d8;
  uStack_680 = uStack_470;
  local_668 = local_4d8;
  uStack_660 = uStack_4d0;
  local_628 = local_308;
  uStack_620 = uStack_300;
  local_618 = local_4b8;
  uStack_610 = uStack_490;
  local_5f8 = local_4b8;
  uStack_5f0 = uStack_4b0;
  HitList::HitList((HitList *)CONCAT44(in_stack_ffffffffffff5494,in_stack_ffffffffffff5490),
                   (TutorialData *)CONCAT44(in_stack_ffffffffffff548c,in_stack_ffffffffffff5488));
  switch(*(undefined4 *)(local_9e8 + 0x1c)) {
  case 0:
    single_pass(in_stack_ffffffffffff5560,in_stack_ffffffffffff5558,in_stack_ffffffffffff5550,
                (RandomSampler *)in_stack_ffffffffffff5548,
                (RayStats *)CONCAT44(in_stack_ffffffffffff5544,in_stack_ffffffffffff5540),
                in_stack_ffffffffffff553c);
    break;
  case 1:
    multi_pass((TutorialData *)in_stack_ffffffffffff5558,(Ray *)in_stack_ffffffffffff5550,
               in_stack_ffffffffffff5548,in_stack_ffffffffffff5544,
               (RandomSampler *)CONCAT44(in_stack_ffffffffffff553c,in_stack_ffffffffffff5538),
               in_stack_ffffffffffff5530,in_stack_ffffffffffff55d0);
    break;
  case 2:
    local_898 = *(int *)(*(long *)(local_9e8 + 0x30) +
                        (ulong)(local_a10 * local_9f4 + local_a0c) * 4);
    local_894 = 1;
    in_stack_ffffffffffff5494 = local_898;
    if (local_898 < 2) {
      in_stack_ffffffffffff5494 = 1;
    }
    multi_pass((TutorialData *)in_stack_ffffffffffff5558,(Ray *)in_stack_ffffffffffff5550,
               in_stack_ffffffffffff5548,in_stack_ffffffffffff5544,
               (RandomSampler *)CONCAT44(in_stack_ffffffffffff553c,in_stack_ffffffffffff5538),
               in_stack_ffffffffffff5530,in_stack_ffffffffffff55d0);
    break;
  case 3:
    in_stack_ffffffffffff5490 = (float)*(uint *)(local_9e8 + 0x20);
    local_888 = 0.5 / *(float *)(local_9e8 + 0x2c);
    local_884 = 0x3f800000;
    in_stack_ffffffffffff548c = local_888;
    if (local_888 <= 1.0) {
      in_stack_ffffffffffff548c = 1.0;
    }
    in_stack_ffffffffffff5488 = in_stack_ffffffffffff548c;
    if (in_stack_ffffffffffff5490 < in_stack_ffffffffffff548c) {
      in_stack_ffffffffffff5488 = in_stack_ffffffffffff5490;
    }
    local_890 = in_stack_ffffffffffff548c;
    local_88c = in_stack_ffffffffffff5490;
    multi_pass((TutorialData *)in_stack_ffffffffffff5558,(Ray *)in_stack_ffffffffffff5550,
               in_stack_ffffffffffff5548,in_stack_ffffffffffff5544,
               (RandomSampler *)CONCAT44(in_stack_ffffffffffff553c,in_stack_ffffffffffff5538),
               in_stack_ffffffffffff5530,in_stack_ffffffffffff55d0);
  }
  bVar7 = false;
  if (((*(byte *)(local_9e8 + 0x28) & 1) != 0) || ((*(byte *)(local_9e8 + 0x29) & 1) != 0)) {
    HitList::HitList((HitList *)CONCAT44(in_stack_ffffffffffff5494,in_stack_ffffffffffff5490),
                     (TutorialData *)CONCAT44(in_stack_ffffffffffff548c,in_stack_ffffffffffff5488));
    local_9c0 = local_ab0c;
    local_9c4 = local_a0c;
    local_9c8 = local_a10;
    local_9cc = 0;
    local_74c = local_a0c | local_a10 << 0x10;
    local_750 = 0;
    local_708 = 0xcc9e2d51;
    local_70c = 0x1b873593;
    local_710 = 0xf;
    local_714 = 0xd;
    local_718 = 5;
    local_71c = 0xe6546b64;
    uVar4 = local_74c * 0x16a88000 | local_74c * -0x3361d2af >> 0x11;
    local_704 = uVar4 * 0x1b873593;
    local_700 = (uVar4 * -0x194da000 | local_704 >> 0x13) * 5 + 0xe6546b64;
    local_728 = 0xcc9e2d51;
    local_72c = 0x1b873593;
    local_730 = 0xf;
    local_734 = 0xd;
    local_738 = 5;
    local_73c = 0xe6546b64;
    local_724 = 0;
    local_720 = (local_700 * 0x2000 | local_700 >> 0x13) * 5 + 0xe6546b64;
    uVar4 = (local_720 >> 0x10 ^ local_720) * -0x7a143595;
    local_754 = (uVar4 >> 0xd ^ uVar4) * -0x3d4d51cb;
    local_754 = local_754 >> 0x10 ^ local_754;
    local_748 = local_9c0;
    local_6fc = local_754;
    local_ab0c[0] = local_754;
    single_pass(in_stack_ffffffffffff5560,in_stack_ffffffffffff5558,in_stack_ffffffffffff5550,
                (RandomSampler *)in_stack_ffffffffffff5548,
                (RayStats *)CONCAT44(in_stack_ffffffffffff5544,in_stack_ffffffffffff5540),
                in_stack_ffffffffffff553c);
    uVar4 = HitList::size((HitList *)(local_ab0c + 1));
    uVar5 = HitList::size(&local_5ae8);
    bVar7 = uVar4 != uVar5;
    for (local_ab18 = (ulong)local_ab00; local_ab18 < local_aafc; local_ab18 = local_ab18 + 1) {
      local_878 = auStack_aaf8 + local_ab18 * 0x14;
      local_880 = local_5ae8.hits + local_ab18;
      pfVar1 = &local_5ae8.hits[local_ab18].t;
      bVar8 = false;
      if (((((&fStack_aaf4)[local_ab18 * 5] == *pfVar1) &&
           (!NAN((&fStack_aaf4)[local_ab18 * 5]) && !NAN(*pfVar1))) &&
          (bVar8 = false, auStack_aaf0[local_ab18 * 5] == local_5ae8.hits[local_ab18].primID)) &&
         (bVar8 = false, auStack_aaf0[local_ab18 * 5 + 1] == local_5ae8.hits[local_ab18].geomID)) {
        bVar8 = auStack_aaf0[local_ab18 * 5 + 2] == local_5ae8.hits[local_ab18].instID;
      }
      if (!bVar8) {
        bVar7 = true;
      }
      local_870 = local_880;
      local_868 = local_878;
    }
    if (((*(byte *)(local_9e8 + 0x29) & 1) == 0) && (bVar7)) {
      poVar6 = std::operator<<((ostream *)&std::cout,"error at (");
      this = (void *)std::ostream::operator<<(poVar6,(int)local_9ec);
      poVar6 = (ostream *)std::ostream::operator<<(this,(int)local_9f0);
      poVar6 = std::operator<<(poVar6,")");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
  }
  memset(&local_ab1c,0,4);
  for (local_ab28 = (ulong)local_5ae8.begin; local_ab28 < local_5ae8.end;
      local_ab28 = local_ab28 + 1) {
    uVar4 = local_5ae8.hits[local_ab28].instID;
    local_808 = 0xcc9e2d51;
    local_80c = 0x1b873593;
    local_810 = 0xf;
    local_814 = 0xd;
    local_818 = 5;
    local_81c = 0xe6546b64;
    local_804 = (uVar4 * 0x16a88000 | uVar4 * -0x3361d2af >> 0x11) * 0x1b873593;
    local_800 = ((local_804 ^ local_ab1c) << 0xd | (local_804 ^ local_ab1c) >> 0x13) * 5 +
                0xe6546b64;
    uVar4 = local_5ae8.hits[local_ab28].geomID;
    local_828 = 0xcc9e2d51;
    local_82c = 0x1b873593;
    local_830 = 0xf;
    local_834 = 0xd;
    local_838 = 5;
    local_83c = 0xe6546b64;
    local_824 = (uVar4 * 0x16a88000 | uVar4 * -0x3361d2af >> 0x11) * 0x1b873593;
    local_820 = ((local_824 ^ local_800) << 0xd | (local_824 ^ local_800) >> 0x13) * 5 + 0xe6546b64;
    uVar4 = local_5ae8.hits[local_ab28].primID;
    local_848 = 0xcc9e2d51;
    local_84c = 0x1b873593;
    local_850 = 0xf;
    local_854 = 0xd;
    local_858 = 5;
    local_85c = 0xe6546b64;
    local_844 = (uVar4 * 0x16a88000 | uVar4 * -0x3361d2af >> 0x11) * 0x1b873593;
    local_ab1c = ((local_844 ^ local_820) << 0xd | (local_844 ^ local_820) >> 0x13) * 5 + 0xe6546b64
    ;
    local_840 = local_ab1c;
  }
  uVar4 = (local_ab1c >> 0x10 ^ local_ab1c) * -0x7a143595;
  local_7fc = (uVar4 >> 0xd ^ uVar4) * -0x3d4d51cb;
  local_7fc = local_7fc >> 0x10 ^ local_7fc;
  local_7e0 = &local_ab1c;
  local_278 = 0x19660d;
  local_27c = 0x3c6ef35f;
  local_280 = local_7fc * 0x19660d + 0x3c6ef35f;
  *in_RDI = (float)(local_280 >> 1) * 4.656613e-10;
  local_7e8 = &local_ab1c;
  local_284 = 0x19660d;
  local_288 = 0x3c6ef35f;
  local_28c = local_280 * 0x19660d + 0x3c6ef35f;
  in_RDI[1] = (float)(local_28c >> 1) * 4.656613e-10;
  local_7f0 = &local_ab1c;
  local_290 = 0x19660d;
  local_294 = 0x3c6ef35f;
  local_ab1c = local_28c * 0x19660d + 0x3c6ef35f;
  in_RDI[2] = (float)(local_ab1c >> 1) * 4.656613e-10;
  in_RDI[1] = in_RDI[2];
  *in_RDI = in_RDI[2];
  if (bVar7) {
    local_7c8 = &local_ab38;
    local_7cc = 0x3f800000;
    local_7d0 = 0;
    local_7d4 = 0;
    local_6dc = 0;
    local_6e0 = 0;
    local_6e4 = 0;
    local_6e8 = 0x3f800000;
    local_6f8 = 0x3f800000;
    uStack_6f0 = 0;
    local_ab38 = 0x3f800000;
    uStack_ab30 = 0;
    local_7c0 = &local_ab38;
    in_RDI[0] = 1.0;
    in_RDI[1] = 0.0;
    in_RDI[2] = 0.0;
    in_RDI[3] = 0.0;
  }
  local_2b0 = local_7e0;
  local_2a8 = local_7e8;
  local_2a0 = local_7f0;
  local_274 = local_7fc;
  uVar4 = HitList::size(&local_5ae8);
  auVar11._0_4_ = (float)uVar4;
  auVar11._4_12_ = extraout_var;
  in_RDI[3] = auVar11._0_4_;
  VVar12.field_0._0_8_ = auVar11._0_8_;
  VVar12.field_0._8_8_ = in_RDI;
  return (Vec3ff)VVar12.field_0;
}

Assistant:

Vec3ff renderPixelStandard(const TutorialData& data, float x, float y,
                           const unsigned int width,
                           const unsigned int height,
                           const ISPCCamera& camera,
                           RayStats& stats,
                           const RTCFeatureFlags feature_mask)
{
  /* initialize sampler */
  const int ix = (int)x;
  const int iy = (int)y;
  RandomSampler mysampler;
  RandomSampler_init(mysampler, ix, iy, 0);
  
  /* initialize ray */
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf, 0.0f);

  /* either gather hits in single pass or using multiple passes */
  HitList hits(data);
  switch (data.next_hit_mode)
  {
  case SINGLE_PASS:
    single_pass(data,ray,hits,mysampler,stats,feature_mask);
    break;
  
  case MULTI_PASS_FIXED_NEXT_HITS:
    multi_pass (data,ray,hits,data.max_next_hits,mysampler,stats,feature_mask);
    break;
#if !defined(EMBREE_SYCL_TUTORIAL)
  case MULTI_PASS_OPTIMAL_NEXT_HITS: {
    int num_prev_hits = max(1,data.num_prev_hits[iy*width+ix]);
    multi_pass (data,ray,hits,num_prev_hits,mysampler,stats,feature_mask);
    break;
  }
  case MULTI_PASS_ESTIMATED_NEXT_HITS: {
    int estimated_num_next_hits = (int) min((float)data.max_next_hits, max(1.0f, 0.5f/data.curve_opacity));
    multi_pass (data,ray,hits,estimated_num_next_hits,mysampler,stats,feature_mask);
    break;
  }
#endif
  default:
    assert(false);
  }

  /* verify result with gathering all hits */
  bool has_error = false;
  if (data.verify || data.visualize_errors)
  {
    /* repeat using a single pass, which is assumed to produce the correct result */
    HitList verify_hits(data);
    RandomSampler verify_sampler;
    RandomSampler_init(verify_sampler, ix, iy, 0);
    single_pass(data,ray,verify_hits,verify_sampler,stats,feature_mask);

    if (verify_hits.size() != hits.size())
      has_error = true;
    
    for (size_t i=verify_hits.begin; i<verify_hits.end; i++)
    {
      if (verify_hits.hits[i] != hits.hits[i])
        has_error = true;
    }

    if (!data.visualize_errors && has_error) {
      embree_cout << "error at (" << int(x) << int(y) << ")" << embree_endl;
    }
  }

  /* calculate random sequence based on hit geomIDs and primIDs */
  RandomSampler sampler = { 0 };
  for (size_t i=hits.begin; i<hits.end; i++) {
    sampler.s = MurmurHash3_mix(sampler.s, hits.hits[i].instID);
    sampler.s = MurmurHash3_mix(sampler.s, hits.hits[i].geomID);
    sampler.s = MurmurHash3_mix(sampler.s, hits.hits[i].primID);
  }
  sampler.s = MurmurHash3_finalize(sampler.s);

  /* map geomID/primID sequence to color */
  Vec3ff color;
  color.x = RandomSampler_getFloat(sampler);
  color.y = RandomSampler_getFloat(sampler);
  color.z = RandomSampler_getFloat(sampler);

  /* mark errors red */
  //if (data.visualize_errors)
  {
    color.x = color.y = color.z;
    if (has_error)
      color = Vec3ff(1,0,0);
  }
  
  color.w = (float) hits.size();
  return color;
}